

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDetectionResultColumn.cpp
# Opt level: O1

void __thiscall
ZXing::Pdf417::DetectionResultColumn::adjustCompleteIndicatorColumnRowNumbers
          (DetectionResultColumn *this,BarcodeMetadata *barcodeMetadata)

{
  vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  *codewords;
  RowIndicator RVar1;
  int iVar2;
  pointer pNVar3;
  int iVar4;
  Nullable<ZXing::ResultPoint> *pNVar5;
  Nullable<ZXing::ResultPoint> *pNVar6;
  uint uVar7;
  Nullable<ZXing::Pdf417::Codeword> *codeword;
  pointer pNVar8;
  char cVar9;
  int iVar10;
  long lVar11;
  bool *pbVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  Codeword codeword_1;
  uint local_64;
  Codeword local_44;
  
  RVar1 = this->_rowIndicator;
  if (RVar1 != None) {
    codewords = &this->_codewords;
    pNVar3 = (this->_codewords).
             super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pNVar8 = (this->_codewords).
                  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pNVar8 != pNVar3; pNVar8 = pNVar8 + 1)
    {
      if (pNVar8->m_hasValue == true) {
        (pNVar8->m_value)._rowNumber =
             (pNVar8->m_value)._bucket / 3 + ((pNVar8->m_value)._value / 0x1e) * 3;
      }
    }
    RemoveIncorrectCodewords(RVar1 == Left,codewords,barcodeMetadata);
    pNVar5 = &(this->_boundingBox)._topLeft;
    pNVar6 = &(this->_boundingBox)._bottomLeft;
    if (this->_rowIndicator != Left) {
      pNVar6 = &(this->_boundingBox)._bottomRight;
      pNVar5 = &(this->_boundingBox)._topRight;
    }
    iVar16 = (int)(pNVar5->m_value).super_PointF.y;
    iVar17 = (int)(pNVar6->m_value).super_PointF.y;
    if (iVar16 < iVar17) {
      iVar2 = (this->_boundingBox)._minY;
      lVar14 = (long)(iVar16 - iVar2);
      lVar11 = lVar14 * 0x18 + -0x18;
      iVar15 = 0;
      iVar16 = -1;
      local_64 = 1;
      iVar4 = 1;
      do {
        pNVar8 = (codewords->
                 super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (pNVar8[lVar14].m_hasValue == true) {
          Nullable::operator_cast_to_Codeword(&local_44,(Nullable *)(pNVar8 + lVar14));
          if (iVar16 == -1) {
            iVar16 = barcodeMetadata->_rowCountLowerPart + barcodeMetadata->_rowCountUpperPart;
            if (local_44._rowNumber ==
                barcodeMetadata->_rowCountUpperPart + barcodeMetadata->_rowCountLowerPart + -1) {
              local_64 = 0xffffffff;
            }
            else {
              iVar16 = -1;
            }
          }
          uVar7 = local_44._rowNumber - iVar16;
          if (uVar7 == 0) {
            iVar15 = iVar15 + 1;
          }
          else if (uVar7 == local_64) {
            iVar10 = iVar15;
            if (iVar15 < iVar4) {
              iVar10 = iVar4;
            }
LAB_00173070:
            iVar15 = 1;
            iVar16 = local_44._rowNumber;
            iVar4 = iVar10;
          }
          else {
            if (((-1 < (int)uVar7) && ((long)(ulong)uVar7 <= lVar14)) &&
               (local_44._rowNumber <
                barcodeMetadata->_rowCountLowerPart + barcodeMetadata->_rowCountUpperPart)) {
              iVar10 = iVar4 + -2;
              if (iVar4 < 3) {
                iVar10 = 1;
              }
              uVar7 = uVar7 * iVar10;
              cVar9 = lVar14 <= (int)uVar7;
              if (((int)uVar7 < lVar14) && (0 < (int)uVar7)) {
                pbVar12 = &((codewords->
                            super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->m_hasValue + lVar11;
                uVar13 = 1;
                do {
                  cVar9 = *pbVar12;
                  if (uVar7 <= uVar13) break;
                  uVar13 = uVar13 + 1;
                  pbVar12 = pbVar12 + -0x18;
                } while ((bool)cVar9 == false);
              }
              iVar10 = iVar4;
              if (cVar9 == '\0') goto LAB_00173070;
            }
            pNVar8 = (codewords->
                     super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pNVar8[lVar14].m_hasValue = false;
            pNVar3 = pNVar8 + lVar14;
            (pNVar3->m_value)._startX = 0;
            (pNVar3->m_value)._endX = 0;
            (pNVar3->m_value)._bucket = 0;
            (pNVar3->m_value)._value = 0;
            pNVar8[lVar14].m_value._rowNumber = -1;
          }
        }
        lVar14 = lVar14 + 1;
        lVar11 = lVar11 + 0x18;
      } while (lVar14 < iVar17 - iVar2);
    }
  }
  return;
}

Assistant:

void
DetectionResultColumn::adjustCompleteIndicatorColumnRowNumbers(const BarcodeMetadata& barcodeMetadata)
{
	if (!isRowIndicator()) {
		return;
	}

	auto& codewords = allCodewords();
	setRowNumbers();
	RemoveIncorrectCodewords(isLeftRowIndicator(), codewords, barcodeMetadata);
	const auto& bb = boundingBox();
	auto top = isLeftRowIndicator() ? bb.topLeft() : bb.topRight();
	auto bottom = isLeftRowIndicator() ? bb.bottomLeft() : bb.bottomRight();
	int firstRow = imageRowToCodewordIndex((int)top.value().y());
	int lastRow = imageRowToCodewordIndex((int)bottom.value().y());
	// We need to be careful using the average row height. Barcode could be skewed so that we have smaller and
	// taller rows
	//float averageRowHeight = (lastRow - firstRow) / (float)barcodeMetadata.rowCount();
	int barcodeRow = -1;
	int maxRowHeight = 1;
	int currentRowHeight = 0;
	int increment = 1;
	for (int codewordsRow = firstRow; codewordsRow < lastRow; codewordsRow++) {
		if (codewords[codewordsRow] == nullptr) {
			continue;
		}
		Codeword codeword = codewords[codewordsRow];
		if (barcodeRow == -1 && codeword.rowNumber() == barcodeMetadata.rowCount() - 1) {
			increment = -1;
			barcodeRow = barcodeMetadata.rowCount();
		}
		//      float expectedRowNumber = (codewordsRow - firstRow) / averageRowHeight;
		//      if (Math.abs(codeword.getRowNumber() - expectedRowNumber) > 2) {
		//        SimpleLog.log(LEVEL.WARNING,
		//            "Removing codeword, rowNumberSkew too high, codeword[" + codewordsRow + "]: Expected Row: " +
		//                expectedRowNumber + ", RealRow: " + codeword.getRowNumber() + ", value: " + codeword.getValue());
		//        codewords[codewordsRow] = null;
		//      }

		int rowDifference = codeword.rowNumber() - barcodeRow;

		if (rowDifference == 0) {
			currentRowHeight++;
		}
		else if (rowDifference == increment) {
			maxRowHeight = std::max(maxRowHeight, currentRowHeight);
			currentRowHeight = 1;
			barcodeRow = codeword.rowNumber();
		}
		else if (rowDifference < 0 ||
			codeword.rowNumber() >= barcodeMetadata.rowCount() ||
			rowDifference > codewordsRow) {
			codewords[codewordsRow] = nullptr;
		}
		else {
			int checkedRows;
			if (maxRowHeight > 2) {
				checkedRows = (maxRowHeight - 2) * rowDifference;
			}
			else {
				checkedRows = rowDifference;
			}
			bool closePreviousCodewordFound = checkedRows >= codewordsRow;
			for (int i = 1; i <= checkedRows && !closePreviousCodewordFound; i++) {
				// there must be (height * rowDifference) number of codewords missing. For now we assume height = 1.
				// This should hopefully get rid of most problems already.
				closePreviousCodewordFound = codewords[codewordsRow - i] != nullptr;
			}
			if (closePreviousCodewordFound) {
				codewords[codewordsRow] = nullptr;
			}
			else {
				barcodeRow = codeword.rowNumber();
				currentRowHeight = 1;
			}
		}
	}
	//return static_cast<int>(averageRowHeight + 0.5);
}